

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::attachment_advanced_equation
               (NegativeTestContext *ctx)

{
  bool bVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  bool bVar4;
  deBool dVar5;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 program_00;
  GLenum GVar6;
  RenderContext *pRVar7;
  NotSupportedError *this;
  TestLog *log;
  TestError *this_00;
  bool local_292;
  bool local_279;
  int local_278;
  allocator<char> local_271;
  int ndx_1;
  allocator<char> local_249;
  string local_248;
  ProgramSources local_228;
  undefined1 local_158 [8];
  ShaderProgram program;
  int ndx;
  GLenum local_60 [2];
  GLenum attachments [2];
  GLuint texture;
  GLuint fbo;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar5 = ::deGetFalse();
    pNVar2 = local_10;
    bVar1 = false;
    bVar4 = false;
    local_279 = false;
    if (dVar5 == 0) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"GL_KHR_blend_equation_advanced",&local_31);
      bVar4 = true;
      bVar3 = NegativeTestContext::isExtensionSupported(pNVar2,&local_30);
      local_292 = true;
      if (!bVar3) {
        pRVar7 = NegativeTestContext::getRenderContext(local_10);
        ctxType.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
        requiredApiType = glu::ApiType::es(3,2);
        local_292 = glu::contextSupports(ctxType,requiredApiType);
      }
      local_279 = local_292;
    }
    if (bVar4) {
      std::__cxx11::string::~string((string *)&local_30);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_31);
    }
    if (((local_279 ^ 0xffU) & 1) != 0) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      attachments[1] = 0x1234;
      attachments[0] = 0x1234;
      local_60[0] = 0x8ce0;
      local_60[1] = 0x8ce1;
      glu::CallLogWrapper::glGenTextures(&local_10->super_CallLogWrapper,1,attachments);
      glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0xde1,attachments[0]);
      glu::CallLogWrapper::glTexImage2D
                (&local_10->super_CallLogWrapper,0xde1,0,0x8058,0x20,0x20,0,0x1908,0x1401,
                 (void *)0x0);
      glu::CallLogWrapper::glGenFramebuffers(&local_10->super_CallLogWrapper,1,attachments + 1);
      glu::CallLogWrapper::glBindFramebuffer(&local_10->super_CallLogWrapper,0x8d40,attachments[1]);
      glu::CallLogWrapper::glFramebufferTexture2D
                (&local_10->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,attachments[0],0);
      NegativeTestContext::expectError(local_10,0);
      glu::CallLogWrapper::glCheckFramebufferStatus(&local_10->super_CallLogWrapper,0x8d40);
      pNVar2 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndx,
                 "GL_INVALID_OPERATION is generated if blending is enabled, advanced equations are used, and the draw buffer for other color outputs is not NONE."
                 ,(allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      NegativeTestContext::beginSection(pNVar2,(string *)&ndx);
      std::__cxx11::string::~string((string *)&ndx);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
      program.m_program.m_info.linkTimeUs._0_4_ = 0;
      do {
        if (0xe < (int)program.m_program.m_info.linkTimeUs) {
          NegativeTestContext::endSection(local_10);
          pNVar2 = local_10;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,
                     "GL_NO_ERROR is generated if no advanced blend equations are used.",&local_249)
          ;
          NegativeTestContext::beginSection(pNVar2,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          glu::CallLogWrapper::glBlendEquation(&local_10->super_CallLogWrapper,0x8006);
          glu::CallLogWrapper::glDrawElements
                    (&local_10->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
          NegativeTestContext::expectError(local_10,0);
          NegativeTestContext::endSection(local_10);
          pNVar2 = local_10;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ndx_1,"GL_NO_ERROR is generated if blending is disabled.",&local_271
                    );
          NegativeTestContext::beginSection(pNVar2,(string *)&ndx_1);
          std::__cxx11::string::~string((string *)&ndx_1);
          std::allocator<char>::~allocator(&local_271);
          glu::CallLogWrapper::glDisable(&local_10->super_CallLogWrapper,0xbe2);
          for (local_278 = 0; pNVar2 = local_10, local_278 < 0xf; local_278 = local_278 + 1) {
            GVar6 = getEquation(*(BlendEquation *)
                                 ((anonymous_namespace)::s_equations + (long)local_278 * 4));
            glu::CallLogWrapper::glBlendEquation(&pNVar2->super_CallLogWrapper,GVar6);
            glu::CallLogWrapper::glDrawElements
                      (&local_10->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
            NegativeTestContext::expectError(local_10,0);
          }
          NegativeTestContext::endSection(local_10);
          glu::CallLogWrapper::glDeleteFramebuffers
                    (&local_10->super_CallLogWrapper,1,attachments + 1);
          glu::CallLogWrapper::glDeleteTextures(&local_10->super_CallLogWrapper,1,attachments);
          return;
        }
        pRVar7 = NegativeTestContext::getRenderContext(local_10);
        generateProgramSources
                  (&local_228,local_10,
                   *(BlendEquation *)
                    ((anonymous_namespace)::s_equations +
                    (long)(int)program.m_program.m_info.linkTimeUs * 4));
        glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_158,pRVar7,&local_228);
        glu::ProgramSources::~ProgramSources(&local_228);
        log = glu::CallLogWrapper::getLog(&local_10->super_CallLogWrapper);
        glu::operator<<(log,(ShaderProgram *)local_158);
        do {
          dVar5 = ::deGetFalse();
          if ((dVar5 != 0) || (bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_158), !bVar4)
             ) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"program.isOk()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeAdvancedBlendEquationTests.cpp"
                       ,0xe8);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar5 = ::deGetFalse();
          pNVar2 = local_10;
        } while (dVar5 != 0);
        program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
        glu::CallLogWrapper::glUseProgram(&pNVar2->super_CallLogWrapper,program_00);
        glu::CallLogWrapper::glEnable(&local_10->super_CallLogWrapper,0xbe2);
        glu::CallLogWrapper::glDrawBuffers(&local_10->super_CallLogWrapper,2,local_60);
        NegativeTestContext::expectError(local_10,0);
        pNVar2 = local_10;
        GVar6 = getEquation(*(BlendEquation *)
                             ((anonymous_namespace)::s_equations +
                             (long)(int)program.m_program.m_info.linkTimeUs * 4));
        glu::CallLogWrapper::glBlendEquation(&pNVar2->super_CallLogWrapper,GVar6);
        glu::CallLogWrapper::glDrawElements(&local_10->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
        NegativeTestContext::expectError(local_10,0x502);
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_158);
        program.m_program.m_info.linkTimeUs._0_4_ = (int)program.m_program.m_info.linkTimeUs + 1;
      } while( true );
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,
             "This test requires support for the extension GL_KHR_blend_equation_advanced or context version 3.2 or higher."
             ,
             "ctx.isExtensionSupported(\"GL_KHR_blend_equation_advanced\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeAdvancedBlendEquationTests.cpp"
             ,0xd4);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void attachment_advanced_equation (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		ctx.isExtensionSupported("GL_KHR_blend_equation_advanced") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)),
		"This test requires support for the extension GL_KHR_blend_equation_advanced or context version 3.2 or higher.");

	glw::GLuint			fbo				= 0x1234;
	glw::GLuint			texture			= 0x1234;
	const glw::GLenum	attachments[]	= { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);

	ctx.beginSection("GL_INVALID_OPERATION is generated if blending is enabled, advanced equations are used, and the draw buffer for other color outputs is not NONE.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_equations); ++ndx)
	{
		glu::ShaderProgram	program(ctx.getRenderContext(), generateProgramSources(ctx, s_equations[ndx]));
		ctx.getLog() << program;
		TCU_CHECK(program.isOk());

		ctx.glUseProgram(program.getProgram());
		ctx.glEnable(GL_BLEND);
		ctx.glDrawBuffers(2, attachments);
		ctx.expectError(GL_NO_ERROR);
		ctx.glBlendEquation(getEquation(s_equations[ndx]));
		ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.beginSection("GL_NO_ERROR is generated if no advanced blend equations are used.");
	ctx.glBlendEquation(GL_FUNC_ADD);
	ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_NO_ERROR is generated if blending is disabled.");
	ctx.glDisable(GL_BLEND);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_equations); ++ndx)
	{
		ctx.glBlendEquation(getEquation(s_equations[ndx]));
		ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
		ctx.expectError(GL_NO_ERROR);
	}
	ctx.endSection();

	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.glDeleteTextures(1, &texture);
}